

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::EditBackspace(Linenoise *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if ((this->pos != 0) && (this->len != 0)) {
    sVar1 = Utf8Proc::PreviousGraphemeCluster(this->buf,this->len,this->pos);
    sVar2 = this->pos;
    memmove(this->buf + sVar1,this->buf + sVar2,this->len - sVar2);
    sVar2 = (sVar1 - sVar2) + this->len;
    this->len = sVar2;
    this->pos = sVar1;
    this->buf[sVar2] = '\0';
    RefreshLine(this);
    return;
  }
  return;
}

Assistant:

void Linenoise::EditBackspace() {
	if (pos > 0 && len > 0) {
		size_t new_pos = PrevChar();
		size_t char_sz = pos - new_pos;
		memmove(buf + new_pos, buf + pos, len - pos);
		len -= char_sz;
		pos = new_pos;
		buf[len] = '\0';
		RefreshLine();
	}
}